

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# private.hpp
# Opt level: O2

void __thiscall
baryonyx::to_log<int,int,double,int,unsigned_long>
          (baryonyx *this,FILE *os,uint indent,string_view fmt,int *args,int *args_1,double *args_2,
          int *args_3,unsigned_long *args_4)

{
  undefined4 in_register_00000014;
  uint local_44;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  
  local_40._M_len = CONCAT44(in_register_00000014,indent);
  local_40._M_str = (char *)fmt._M_len;
  local_44 = (uint)os;
  ::fmt::v7::print<char[6],char_const(&)[1],unsigned_int&,char>
            ((FILE *)this,(char (*) [6])"{:{}}",(char (*) [1])0x54e7d1,&local_44);
  ::fmt::v7::
  print<std::basic_string_view<char,std::char_traits<char>>,int_const&,int_const&,double_const&,int_const&,unsigned_long_const&,char>
            ((FILE *)this,&local_40,(int *)fmt._M_str,args,(double *)args_1,(int *)args_2,
             (unsigned_long *)args_3);
  return;
}

Assistant:

void
to_log([[maybe_unused]] std::FILE* os,
       [[maybe_unused]] unsigned indent,
       [[maybe_unused]] const std::string_view fmt,
       [[maybe_unused]] const Args&... args)
{
#ifdef BARYONYX_ENABLE_LOG
#ifdef BARYONYX_ENABLE_DEBUG
    fmt::print(os, "{:{}}", "", indent);
    fmt::print(os, fmt, args...);
#endif
#endif
}